

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCurl.cxx
# Opt level: O3

bool __thiscall
cmCTestCurl::HttpRequest(cmCTestCurl *this,string *url,string *fields,string *response)

{
  cmCTest *pcVar1;
  bool bVar2;
  CURLcode CVar3;
  ostream *poVar4;
  string curlDebug;
  vector<char,_std::allocator<char>_> debugData;
  vector<char,_std::allocator<char>_> responseData;
  ostringstream cmCTestLog_msg;
  long *local_228;
  long local_220;
  long local_218 [2];
  void *local_208;
  void *pvStack_200;
  long local_1f8;
  void *local_1e8;
  void *pvStack_1e0;
  long local_1d8;
  long *local_1c8;
  long local_1b8 [2];
  undefined1 local_1a8 [16];
  _func_int *local_198 [12];
  ios_base local_138 [264];
  
  std::__cxx11::string::_M_replace((ulong)response,0,(char *)response->_M_string_length,0x5f43ef);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"HttpRequest\n",0xc);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"url: ",5);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,(url->_M_dataplus)._M_p,url->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"fields ",7);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,(fields->_M_dataplus)._M_p,fields->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  pcVar1 = this->CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar1,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestCurl.cxx"
               ,0xd4,(char *)local_228,false);
  if (local_228 != local_218) {
    operator_delete(local_228,local_218[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  bVar2 = InitCurl(this);
  if (bVar2) {
    curl_easy_setopt(this->Curl,CURLOPT_POST,1);
    curl_easy_setopt(this->Curl,CURLOPT_POSTFIELDS,(fields->_M_dataplus)._M_p);
    curl_easy_setopt(this->Curl,CURLOPT_URL,(url->_M_dataplus)._M_p);
    curl_easy_setopt(this->Curl,CURLOPT_FOLLOWLOCATION,1);
    curl_easy_setopt(this->Curl,CURLOPT_WRITEFUNCTION,
                     anon_unknown.dwarf_3c65d7::curlWriteMemoryCallback);
    curl_easy_setopt(this->Curl,CURLOPT_DEBUGFUNCTION,anon_unknown.dwarf_3c65d7::curlDebugCallback);
    local_1d8 = 0;
    local_1e8 = (void *)0x0;
    pvStack_1e0 = (void *)0x0;
    local_1f8 = 0;
    local_208 = (void *)0x0;
    pvStack_200 = (void *)0x0;
    curl_easy_setopt(this->Curl,CURLOPT_WRITEDATA);
    curl_easy_setopt(this->Curl,CURLOPT_DEBUGDATA,&local_208);
    curl_easy_setopt(this->Curl,CURLOPT_FAILONERROR,1);
    CVar3 = curl_easy_perform(this->Curl);
    if (pvStack_1e0 != local_1e8) {
      local_1a8._0_8_ = local_198;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                ((string *)local_1a8);
      std::__cxx11::string::operator=((string *)response,(string *)local_1a8);
      if ((_func_int **)local_1a8._0_8_ != local_198) {
        operator_delete((void *)local_1a8._0_8_,(ulong)(local_198[0] + 1));
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"Curl response: [",0x10);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(response->_M_dataplus)._M_p,
                          response->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"]\n",2);
      pcVar1 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar1,0,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestCurl.cxx"
                   ,0xee,(char *)local_228,false);
      if (local_228 != local_218) {
        operator_delete(local_228,local_218[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
    }
    if (pvStack_200 != local_208) {
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>();
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Curl debug: [",0xd);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(char *)local_218,local_220);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"]\n",2);
      pcVar1 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar1,0,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestCurl.cxx"
                   ,0xf3,(char *)local_1c8,false);
      if (local_1c8 != local_1b8) {
        operator_delete(local_1c8,local_1b8[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      local_228 = local_218;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Curl res: ",10);
    poVar4 = (ostream *)std::ostream::operator<<(local_1a8,CVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    pcVar1 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,0,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestCurl.cxx"
                 ,0xf5,(char *)local_228,false);
    if (local_228 != local_218) {
      operator_delete(local_228,local_218[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    bVar2 = CVar3 == CURLE_OK;
    if (local_208 != (void *)0x0) {
      operator_delete(local_208,local_1f8 - (long)local_208);
    }
    if (local_1e8 != (void *)0x0) {
      operator_delete(local_1e8,local_1d8 - (long)local_1e8);
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Initialization of curl failed",0x1d);
    pcVar1 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,6,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestCurl.cxx"
                 ,0xd7,(char *)local_228,false);
    if (local_228 != local_218) {
      operator_delete(local_228,local_218[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool cmCTestCurl::HttpRequest(std::string const& url,
                              std::string const& fields,
                              std::string& response)
{
  response = "";
  cmCTestLog(this->CTest, DEBUG, "HttpRequest\n"
             << "url: " << url << "\n"
             << "fields " << fields << "\n");
  if(!this->InitCurl())
    {
    cmCTestLog(this->CTest, ERROR_MESSAGE, "Initialization of curl failed");
    return false;
    }
  curl_easy_setopt(this->Curl, CURLOPT_POST, 1);
  curl_easy_setopt(this->Curl, CURLOPT_POSTFIELDS, fields.c_str());
  ::curl_easy_setopt(this->Curl, CURLOPT_URL, url.c_str());
  ::curl_easy_setopt(this->Curl, CURLOPT_FOLLOWLOCATION, 1);
  //set response options
  ::curl_easy_setopt(this->Curl, CURLOPT_WRITEFUNCTION,
                     curlWriteMemoryCallback);
  ::curl_easy_setopt(this->Curl, CURLOPT_DEBUGFUNCTION,
        curlDebugCallback);
  std::vector<char> responseData;
  std::vector<char> debugData;
  ::curl_easy_setopt(this->Curl, CURLOPT_FILE, (void *)&responseData);
  ::curl_easy_setopt(this->Curl, CURLOPT_DEBUGDATA, (void *)&debugData);
  ::curl_easy_setopt(this->Curl, CURLOPT_FAILONERROR, 1);

  CURLcode res = ::curl_easy_perform(this->Curl);

  if ( responseData.size() > 0 )
    {
    response = std::string(responseData.begin(), responseData.end());
    cmCTestLog(this->CTest, DEBUG, "Curl response: [" << response << "]\n");
    }
  if ( debugData.size() > 0 )
    {
    std::string curlDebug = std::string(debugData.begin(), debugData.end());
    cmCTestLog(this->CTest, DEBUG, "Curl debug: [" << curlDebug << "]\n");
    }
  cmCTestLog(this->CTest, DEBUG, "Curl res: " << res << "\n");
  return (res == 0);
}